

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privsock.c
# Opt level: O2

int priv_sock_get_int(int fd)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  int res;
  
  res = (int)((ulong)in_RAX >> 0x20);
  sVar1 = readn(fd,&res,4);
  if ((int)sVar1 == 4) {
    return res;
  }
  fwrite("priv_sock_get_result error\n",0x1b,1,_stderr);
  exit(1);
}

Assistant:

int priv_sock_get_int(int fd) {
  int res;
  int ret;
  ret = readn(fd, &res, sizeof(res));
  if (ret != sizeof(res)) {
    fprintf(stderr, "priv_sock_get_result error\n");
    exit(EXIT_FAILURE);
  }
  return res;
}